

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void JudgePart(char *buf,int start_line,int line_num,vector<char,_std::allocator<char>_> *res)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  short sVar5;
  
  pcVar1 = buf + start_line * 6000;
  for (lVar2 = (long)start_line; lVar2 < line_num + start_line; lVar2 = lVar2 + 1) {
    uVar4 = 0;
    uVar3 = (ulong)(uint)features_num;
    if (features_num < 1) {
      uVar3 = uVar4;
    }
    sVar5 = 0;
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      sVar5 = sVar5 + (pcVar1[2] + -0x30) *
                      means_sub.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar4];
      pcVar1 = pcVar1 + 6;
    }
    (res->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
    [lVar2] = (byte)((ushort)(sVar5 + C) >> 0xf) ^ 0x31;
  }
  return;
}

Assistant:

void JudgePart (char * buf, int start_line, int line_num, vector<char> & res) {

#ifdef NO_NEON
    int end_line = start_line + line_num;
    buf = buf + start_line * 6000;
    for (int i = start_line; i < end_line; i++) {
        short norm_delta = 0;
        for (int j = 0; j < features_num; j++) {
            short ret =  (*(buf + 2) - '0');
            norm_delta += means_sub[j] * ret;
            buf += 6;
        }
        norm_delta = norm_delta + C;
        res[i] = norm_delta < 0? '0': '1';
    }
#else

    int N = features_num;
    int i = 0;
    int end_line = start_line + line_num;


    for (i = start_line; i + IB < end_line; i += IB) {
        int16x8_t temp[IB];
        for (int ii = 0; ii < IB; ii++) {
            temp[ii] = vdupq_n_s16(0);
        }


        for (int k = 0; k < N; k += 8) {

            int16x8_t v_b = vld1q_s16(&means_sub[k]);

            int16x8_t v_a[IB];
            for (int ii = 0; ii < IB; ii++) {
                char * start_buf = buf + (i + ii) * 6000 + k * 6;

                short ret[8];
                ret[0] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[1] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[2] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[3] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[4] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[5] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[6] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[7] = (*(start_buf + 2) - '0');

                v_a[ii] = vld1q_s16(ret);

                temp[ii] = vmlaq_s16(temp[ii], v_a[ii], v_b);

            }



        }


        for (int ii = 0; ii < IB; ii++) {
            int16x8_t temp_c = temp[ii];
            short tmp = temp_c[0] + temp_c[1] + temp_c[2] + temp_c[3] + temp_c[4] + temp_c[5] + temp_c[6] + temp_c[7];

            res[i + ii] = (tmp + C < 0)? '0': '1';

        }


    }



#endif
}